

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void __thiscall
miniros::RPCManager::removeASyncConnection(RPCManager *this,ASyncXMLRPCConnectionPtr *conn)

{
  scoped_lock<std::mutex> *in_RDI;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  value_type *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  
  std::scoped_lock<std::mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffa8);
  std::
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::insert((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
            *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffc8);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x497846);
  return;
}

Assistant:

void RPCManager::removeASyncConnection(const ASyncXMLRPCConnectionPtr& conn)
{
  std::scoped_lock<std::mutex> lock(removed_connections_mutex_);
  removed_connections_.insert(conn);
}